

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportInstallFileGenerator::GenerateImportTargetsConfig
          (cmExportInstallFileGenerator *this,ostream *os,string *config,string *suffix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmExportSet *pcVar1;
  pointer ppcVar2;
  cmTargetExport *targetExport;
  cmGeneratorTarget *target;
  TargetType TVar3;
  cmExportInstallFileGenerator *this_00;
  pointer ppcVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  importedLocations;
  ImportPropertyMap properties;
  
  pcVar1 = this->IEGen->ExportSet;
  ppcVar2 = (pcVar1->TargetExports).
            super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  this_00 = this;
  for (ppcVar4 = (pcVar1->TargetExports).
                 super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppcVar4 != ppcVar2; ppcVar4 = ppcVar4 + 1) {
    targetExport = *ppcVar4;
    TVar3 = GetExportTargetType(this_00,targetExport);
    if (TVar3 != INTERFACE_LIBRARY) {
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &properties._M_t._M_impl.super__Rb_tree_header._M_header;
      properties._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &importedLocations._M_t._M_impl.super__Rb_tree_header._M_header;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           importedLocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      properties._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           properties._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      SetImportLocationProperty
                (this_00,config,suffix,targetExport->ArchiveGenerator,&properties,&importedLocations
                );
      SetImportLocationProperty
                (this_00,config,suffix,targetExport->LibraryGenerator,&properties,&importedLocations
                );
      SetImportLocationProperty
                (this_00,config,suffix,targetExport->RuntimeGenerator,&properties,&importedLocations
                );
      SetImportLocationProperty
                (this_00,config,suffix,targetExport->ObjectsGenerator,&properties,&importedLocations
                );
      SetImportLocationProperty
                (this_00,config,suffix,targetExport->FrameworkGenerator,&properties,
                 &importedLocations);
      SetImportLocationProperty
                (this_00,config,suffix,targetExport->BundleGenerator,&properties,&importedLocations)
      ;
      if (properties._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        target = targetExport->Target;
        cmExportFileGenerator::SetImportDetailProperties
                  (&this->super_cmExportFileGenerator,config,suffix,target,&properties,
                   missingTargets);
        cmExportFileGenerator::SetImportLinkInterface
                  (&this->super_cmExportFileGenerator,config,suffix,InstallInterface,target,
                   &properties,missingTargets);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[7])
                  (this,os,config,target,(cmExportInstallFileGenerator *)&properties);
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[8])
                  (this,os,target,(cmExportInstallFileGenerator *)&properties,&importedLocations);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&importedLocations._M_t);
      this_00 = (cmExportInstallFileGenerator *)&properties;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&properties);
    }
  }
  return;
}

Assistant:

void cmExportInstallFileGenerator::GenerateImportTargetsConfig(
  std::ostream& os, const std::string& config, std::string const& suffix,
  std::vector<std::string>& missingTargets)
{
  // Add each target in the set to the export.
  for (cmTargetExport* te : *this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }

    ImportPropertyMap properties;
    std::set<std::string> importedLocations;

    this->SetImportLocationProperty(config, suffix, te->ArchiveGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->LibraryGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->RuntimeGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->ObjectsGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->FrameworkGenerator,
                                    properties, importedLocations);
    this->SetImportLocationProperty(config, suffix, te->BundleGenerator,
                                    properties, importedLocations);

    // If any file location was set for the target add it to the
    // import file.
    if (!properties.empty()) {
      // Get the rest of the target details.
      cmGeneratorTarget* gtgt = te->Target;
      this->SetImportDetailProperties(config, suffix, gtgt, properties,
                                      missingTargets);

      this->SetImportLinkInterface(config, suffix,
                                   cmGeneratorExpression::InstallInterface,
                                   gtgt, properties, missingTargets);

      // TODO: PUBLIC_HEADER_LOCATION
      // This should wait until the build feature propagation stuff
      // is done.  Then this can be a propagated include directory.
      // this->GenerateImportProperty(config, te->HeaderGenerator,
      //                              properties);

      // Generate code in the export file.
      this->GenerateImportPropertyCode(os, config, gtgt, properties);
      this->GenerateImportedFileChecksCode(os, gtgt, properties,
                                           importedLocations);
    }
  }
}